

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

bool __thiscall
libcellml::Importer::ImporterImpl::checkUnitsForCycles
          (ImporterImpl *this,UnitsPtr *units,History *history)

{
  element_type *peVar1;
  IssueImpl *pIVar2;
  AnyCellmlElementImpl *pAVar3;
  bool bVar4;
  bool bVar5;
  size_t sVar6;
  size_t sVar7;
  long *plVar8;
  undefined8 *puVar9;
  element_type *peVar10;
  long *plVar11;
  element_type *peVar12;
  element_type *peVar13;
  ulong *puVar14;
  undefined8 uVar15;
  ModelPtr model_1;
  string resolvingUrl;
  IssuePtr issue;
  IssuePtr issue_1;
  UnitsPtr importedUnits;
  HistoryEpochPtr h;
  ModelPtr model;
  ModelPtr unitsModel;
  undefined1 local_1b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  element_type local_180;
  History *local_150;
  string local_148;
  string local_128;
  IssuePtr local_108;
  element_type local_f8;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  IssuePtr local_c8;
  string local_b8;
  undefined1 local_98 [16];
  HistoryEpochPtr local_88;
  ImporterImpl *local_78;
  ImportSource local_70;
  string local_50;
  
  local_150 = history;
  bVar4 = ImportedEntity::isImport
                    (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_ImportedEntity);
  if (!bVar4) {
    sVar6 = Units::unitCount((units->
                             super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
    bVar4 = sVar6 != 0;
    if (!bVar4) {
      return bVar4;
    }
    sVar6 = 0;
    local_78 = this;
    do {
      Units::unitAttributeReference_abi_cxx11_
                (&local_128,
                 (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 sVar6);
      local_190._M_allocated_capacity =
           (size_type)
           (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_190._8_8_ =
           (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_)->_M_use_count + 1;
        }
      }
      owningModel((ParentedEntityConstPtr *)local_1b0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
      }
      bVar5 = Model::hasUnits((Model *)local_1b0._0_8_,&local_128);
      if (bVar5) {
        Model::units((Model *)&local_190,(string *)local_1b0._0_8_);
        bVar5 = checkUnitsForCycles(local_78,(UnitsPtr *)&local_190,local_150);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
        }
        if (bVar5) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
          }
          goto LAB_00228f0b;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      sVar6 = sVar6 + 1;
      sVar7 = Units::unitCount((units->
                               super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
      bVar4 = sVar6 < sVar7;
      if (!bVar4) {
        return bVar4;
      }
    } while( true );
  }
  ImportedEntity::importSource
            (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ImportedEntity);
  resolvingUrl_abi_cxx11_(&local_128,this,(ImportSourcePtr *)local_1b0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
  }
  local_1b0._0_8_ = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_1b0._8_8_ =
       (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_)->_M_use_count + 1;
    }
  }
  owningModel((ParentedEntityConstPtr *)
              &local_70.super_enable_shared_from_this<libcellml::ImportSource>);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
  }
  local_190._M_allocated_capacity =
       (size_type)(units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_190._8_8_ =
       (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_)->_M_use_count + 1;
    }
  }
  modelUrl_abi_cxx11_((string *)local_1b0,this,
                      (ModelPtr *)&local_70.super_enable_shared_from_this<libcellml::ImportSource>);
  createHistoryEpoch((libcellml *)&local_88,(UnitsConstPtr *)&local_190,(string *)local_1b0,
                     &local_128);
  peVar1 = (element_type *)(local_1b0 + 0x10);
  if ((element_type *)local_1b0._0_8_ != peVar1) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
  }
  ImportedEntity::importSource
            (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ImportedEntity);
  local_1b0._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"flatten","");
  bVar5 = checkForImportCycles
                    (this,(ImportSourcePtr *)&local_190,local_150,&local_88,(string *)local_1b0);
  if ((element_type *)local_1b0._0_8_ != peVar1) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
  }
  bVar4 = true;
  if (bVar5) goto LAB_00228edb;
  std::
  vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ::push_back(local_150,&local_88);
  ImportedEntity::importSource
            (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ImportedEntity);
  ImportSource::model(&local_70);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
  }
  if ((string *)local_70.super_Entity._vptr_Entity == (string *)0x0) {
    Issue::IssueImpl::create();
    pIVar2 = (local_108.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    NamedEntity::name_abi_cxx11_
              (&local_148,
               &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_NamedEntity);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,0x2a2452);
    local_180.super_ImportedEntity._vptr_ImportedEntity =
         (_func_int **)&local_180.super_enable_shared_from_this<libcellml::Units>;
    plVar8 = puVar9 + 2;
    if ((enable_shared_from_this<libcellml::Units> *)*puVar9 ==
        (enable_shared_from_this<libcellml::Units> *)plVar8) {
      local_180.super_enable_shared_from_this<libcellml::Units>._M_weak_this.
      super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*plVar8;
      local_180.super_enable_shared_from_this<libcellml::Units>._M_weak_this.
      super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar9[3];
    }
    else {
      local_180.super_enable_shared_from_this<libcellml::Units>._M_weak_this.
      super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*plVar8;
      local_180.super_ImportedEntity._vptr_ImportedEntity = (_func_int **)*puVar9;
    }
    local_180.super_ImportedEntity.mPimpl = (ImportedEntityImpl *)puVar9[1];
    *puVar9 = plVar8;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_180.super_ImportedEntity);
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_d8 = *plVar11;
      lStack_d0 = plVar8[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *plVar11;
      local_e8 = (long *)*plVar8;
    }
    local_e0 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_e8,(ulong)local_128._M_dataplus._M_p);
    peVar12 = (element_type *)(plVar8 + 2);
    if ((element_type *)*plVar8 == peVar12) {
      local_180.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
           (peVar12->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
      local_180.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl = (EntityImpl *)plVar8[3]
      ;
      local_190._M_allocated_capacity = (size_type)&local_180;
    }
    else {
      local_180.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
           (peVar12->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
      local_190._M_allocated_capacity = (size_type)(element_type *)*plVar8;
    }
    local_190._8_8_ = plVar8[1];
    *plVar8 = (long)peVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append(local_190._M_local_buf);
    peVar13 = (element_type *)(plVar8 + 2);
    if ((element_type *)*plVar8 == peVar13) {
      local_1b0._16_8_ = (peVar13->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity
      ;
      local_1b0._24_8_ = plVar8[3];
      local_1b0._0_8_ = peVar1;
    }
    else {
      local_1b0._16_8_ = (peVar13->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity
      ;
      local_1b0._0_8_ = (element_type *)*plVar8;
    }
    local_1b0._8_8_ = plVar8[1];
    *plVar8 = (long)peVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    Issue::IssueImpl::setDescription(pIVar2,(string *)local_1b0);
    if ((element_type *)local_1b0._0_8_ != peVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((element_type *)local_190._M_allocated_capacity != &local_180) {
      operator_delete((void *)local_190._M_allocated_capacity,
                      (long)local_180.super_NamedEntity.super_ParentedEntity.super_Entity.
                            _vptr_Entity + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if ((enable_shared_from_this<libcellml::Units> *)
        local_180.super_ImportedEntity._vptr_ImportedEntity !=
        &local_180.super_enable_shared_from_this<libcellml::Units>) {
      operator_delete(local_180.super_ImportedEntity._vptr_ImportedEntity,
                      (ulong)((long)&((local_180.super_enable_shared_from_this<libcellml::Units>.
                                       _M_weak_this.
                                       super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity
                                     ._vptr_Entity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    pAVar3 = (((local_108.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl->mItem).
              super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    ImportedEntity::importSource
              (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_ImportedEntity);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource(pAVar3,(ImportSourcePtr *)local_1b0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
    }
    Issue::IssueImpl::setReferenceRule
              ((local_108.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,IMPORTER_NULL_MODEL);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_108);
    if (local_108.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar4 = true;
  }
  else {
    ImportedEntity::importReference_abi_cxx11_
              ((string *)local_1b0,
               &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_ImportedEntity);
    Model::units((Model *)local_98,(string *)local_70.super_Entity._vptr_Entity);
    if ((element_type *)local_1b0._0_8_ != peVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((element_type *)local_98._0_8_ == (element_type *)0x0) {
      Issue::IssueImpl::create();
      pIVar2 = (local_c8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl;
      NamedEntity::name_abi_cxx11_
                (&local_50,
                 &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_NamedEntity);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2a2452);
      local_108.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_f8;
      peVar10 = (element_type *)(plVar8 + 2);
      if ((element_type *)*plVar8 == peVar10) {
        local_f8._vptr_Issue = peVar10->_vptr_Issue;
        local_f8.mPimpl = (IssueImpl *)plVar8[3];
      }
      else {
        local_f8._vptr_Issue = peVar10->_vptr_Issue;
        local_108.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*plVar8;
      }
      local_108.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[1];
      *plVar8 = (long)peVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
      puVar14 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_148.field_2._M_allocated_capacity = *puVar14;
        local_148.field_2._8_8_ = plVar8[3];
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      }
      else {
        local_148.field_2._M_allocated_capacity = *puVar14;
        local_148._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_148._M_string_length = plVar8[1];
      *plVar8 = (long)puVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      ImportedEntity::importReference_abi_cxx11_
                (&local_b8,
                 &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_ImportedEntity);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        uVar15 = local_148.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_b8._M_string_length + local_148._M_string_length) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          uVar15 = local_b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_b8._M_string_length + local_148._M_string_length)
        goto LAB_00228bc1;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_b8,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p);
      }
      else {
LAB_00228bc1:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_148,(ulong)local_b8._M_dataplus._M_p);
      }
      local_180.super_ImportedEntity._vptr_ImportedEntity =
           (_func_int **)&local_180.super_enable_shared_from_this<libcellml::Units>;
      plVar8 = puVar9 + 2;
      if ((enable_shared_from_this<libcellml::Units> *)*puVar9 ==
          (enable_shared_from_this<libcellml::Units> *)plVar8) {
        local_180.super_enable_shared_from_this<libcellml::Units>._M_weak_this.
        super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*plVar8;
        local_180.super_enable_shared_from_this<libcellml::Units>._M_weak_this.
        super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar9[3];
      }
      else {
        local_180.super_enable_shared_from_this<libcellml::Units>._M_weak_this.
        super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*plVar8;
        local_180.super_ImportedEntity._vptr_ImportedEntity = (_func_int **)*puVar9;
      }
      local_180.super_ImportedEntity.mPimpl = (ImportedEntityImpl *)puVar9[1];
      *puVar9 = plVar8;
      puVar9[1] = 0;
      *(undefined1 *)plVar8 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_180.super_ImportedEntity);
      plVar11 = plVar8 + 2;
      if ((long *)*plVar8 == plVar11) {
        local_d8 = *plVar11;
        lStack_d0 = plVar8[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar11;
        local_e8 = (long *)*plVar8;
      }
      local_e0 = plVar8[1];
      *plVar8 = (long)plVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_e8,(ulong)local_128._M_dataplus._M_p);
      peVar12 = (element_type *)(plVar8 + 2);
      if ((element_type *)*plVar8 == peVar12) {
        local_180.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
             (peVar12->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
        local_180.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
             (EntityImpl *)plVar8[3];
        local_190._M_allocated_capacity = (size_type)&local_180;
      }
      else {
        local_180.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
             (peVar12->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
        local_190._M_allocated_capacity = (size_type)(element_type *)*plVar8;
      }
      local_190._8_8_ = plVar8[1];
      *plVar8 = (long)peVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append(local_190._M_local_buf);
      peVar13 = (element_type *)(plVar8 + 2);
      if ((element_type *)*plVar8 == peVar13) {
        local_1b0._16_8_ =
             (peVar13->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
        local_1b0._24_8_ = plVar8[3];
        local_1b0._0_8_ = peVar1;
      }
      else {
        local_1b0._16_8_ =
             (peVar13->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
        local_1b0._0_8_ = (element_type *)*plVar8;
      }
      local_1b0._8_8_ = plVar8[1];
      *plVar8 = (long)peVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar2,(string *)local_1b0);
      if ((element_type *)local_1b0._0_8_ != peVar1) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      if ((element_type *)local_190._M_allocated_capacity != &local_180) {
        operator_delete((void *)local_190._M_allocated_capacity,
                        (long)local_180.super_NamedEntity.super_ParentedEntity.super_Entity.
                              _vptr_Entity + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if ((enable_shared_from_this<libcellml::Units> *)
          local_180.super_ImportedEntity._vptr_ImportedEntity !=
          &local_180.super_enable_shared_from_this<libcellml::Units>) {
        operator_delete(local_180.super_ImportedEntity._vptr_ImportedEntity,
                        (ulong)((long)&((local_180.super_enable_shared_from_this<libcellml::Units>.
                                         _M_weak_this.
                                         super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->super_NamedEntity).super_ParentedEntity.
                                       super_Entity._vptr_Entity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (local_108.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          &local_f8) {
        operator_delete(local_108.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(long)local_f8._vptr_Issue + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pAVar3 = (((local_c8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl;
      ImportedEntity::importSource
                (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_ImportedEntity);
      AnyCellmlElement::AnyCellmlElementImpl::setImportSource(pAVar3,(ImportSourcePtr *)local_1b0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
      }
      Issue::IssueImpl::setReferenceRule
                ((local_c8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl,IMPORTER_MISSING_UNITS);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_c8);
      if (local_c8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      bVar4 = true;
    }
    else {
      bVar4 = checkUnitsForCycles(this,(UnitsPtr *)local_98,local_150);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.super_Entity.mPimpl !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.super_Entity.mPimpl);
  }
LAB_00228edb:
  if (local_88.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_70.super_enable_shared_from_this<libcellml::ImportSource>._M_weak_this.
      super___weak_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super_enable_shared_from_this<libcellml::ImportSource>._M_weak_this.
               super___weak_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
LAB_00228f0b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool Importer::ImporterImpl::checkUnitsForCycles(const UnitsPtr &units, History &history)
{
    // Even if these units are not imported, they might have imported children.
    if (!units->isImport()) {
        for (size_t index = 0; index < units->unitCount(); ++index) {
            std::string ref = units->unitAttributeReference(index);
            // If the child units are imported, check them too.
            auto model = owningModel(units);
            if (model->hasUnits(ref)) {
                if (checkUnitsForCycles(model->units(ref), history)) {
                    return true;
                }
            }
        }
        return false;
    }

    // If they are imported, then they can't have any child unit elements anyway.
    std::string resolvingUrl = ImporterImpl::resolvingUrl(units->importSource());
    auto unitsModel = owningModel(units);
    auto h = createHistoryEpoch(units, modelUrl(unitsModel), resolvingUrl);

    if (checkForImportCycles(units->importSource(), history, h, "flatten")) {
        return true;
    }

    history.push_back(h);

    // If the dependencies have not been recorded already, then check it.
    auto model = units->importSource()->model();
    if (model == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Units '" + units->name() + "' requires a model imported from '" + resolvingUrl + "' which is not available in the importer.");
        issue->mPimpl->mItem->mPimpl->setImportSource(units->importSource());
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_NULL_MODEL);
        addIssue(issue);
        return true;
    }
    auto importedUnits = model->units(units->importReference());
    if (importedUnits == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Units '" + units->name() + "' imports units named '" + units->importReference() + "' from the model imported from '" + resolvingUrl + "'. The units could not be found.");
        issue->mPimpl->mItem->mPimpl->setImportSource(units->importSource());
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_MISSING_UNITS);
        addIssue(issue);
        return true;
    }

    return checkUnitsForCycles(importedUnits, history);
}